

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

QObject ** __thiscall
QHash<QObject_*,_QObject_*>::keyImpl(QHash<QObject_*,_QObject_*> *this,QObject **value)

{
  long lVar1;
  bool bVar2;
  QObject **ppQVar3;
  const_iterator *in_RSI;
  const_iterator *in_RDI;
  long in_FS_OFFSET;
  const_iterator i;
  const_iterator *in_stack_ffffffffffffffb0;
  QObject **local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI->i).d != (Data *)0x0) {
    begin((QHash<QObject_*,_QObject_*> *)in_RDI);
    while( true ) {
      end((QHash<QObject_*,_QObject_*> *)in_RDI);
      bVar2 = const_iterator::operator!=(in_RDI,in_stack_ffffffffffffffb0);
      if (!bVar2) break;
      ppQVar3 = const_iterator::value((const_iterator *)0x4253c3);
      if ((Data<QHashPrivate::Node<QObject_*,_QObject_*>_> *)*ppQVar3 == (in_RSI->i).d) {
        local_30 = const_iterator::key((const_iterator *)0x4253da);
        goto LAB_004253f8;
      }
      const_iterator::operator++(in_RSI);
    }
  }
  local_30 = (QObject **)0x0;
LAB_004253f8:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

const Key *keyImpl(const T &value) const noexcept
    {
        if (d) {
            const_iterator i = begin();
            while (i != end()) {
                if (i.value() == value)
                    return &i.key();
                ++i;
            }
        }

        return nullptr;
    }